

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
QuantifierMatcherImpl<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
::MatchAndExplainImpl
          (QuantifierMatcherImpl<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
           *this,bool all_elements_should_match,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *container,MatchResultListener *listener)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  MatchResultListener *pMVar3;
  byte bVar4;
  long lVar5;
  StringMatchResultListener inner_listener;
  unsigned_long local_200;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *local_1f8;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *local_1f0;
  string local_1e8;
  StringMatchResultListener local_1c8;
  
  local_1f8 = &(this->inner_matcher_).
               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ;
  local_200 = 0;
  local_1f0 = container;
  for (lVar5 = 0; bVar4 = all_elements_should_match, lVar5 != 0x40; lVar5 = lVar5 + 0x20) {
    pbVar1 = local_1f0->_M_elems;
    StringMatchResultListener::StringMatchResultListener(&local_1c8);
    bVar2 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::MatchAndExplain(local_1f8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(pbVar1->_M_dataplus)._M_p + lVar5),
                              &local_1c8.super_MatchResultListener);
    if (bVar2 != all_elements_should_match) {
      pMVar3 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      pMVar3 = MatchResultListener::operator<<(pMVar3,&local_200);
      local_1e8._M_dataplus._M_p = " doesn\'t match";
      if (bVar2) {
        local_1e8._M_dataplus._M_p = " matches";
      }
      MatchResultListener::operator<<(pMVar3,(char **)&local_1e8);
      std::__cxx11::stringbuf::str();
      PrintIfNotEmpty(&local_1e8,listener->stream_);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    StringMatchResultListener::~StringMatchResultListener(&local_1c8);
    bVar4 = !all_elements_should_match;
    if (bVar2 != all_elements_should_match) break;
    local_200 = local_200 + 1;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool MatchAndExplainImpl(bool all_elements_should_match,
                           Container container,
                           MatchResultListener* listener) const {
    StlContainerReference stl_container = View::ConstReference(container);
    size_t i = 0;
    for (typename StlContainer::const_iterator it = stl_container.begin();
         it != stl_container.end(); ++it, ++i) {
      StringMatchResultListener inner_listener;
      const bool matches = inner_matcher_.MatchAndExplain(*it, &inner_listener);

      if (matches != all_elements_should_match) {
        *listener << "whose element #" << i
                  << (matches ? " matches" : " doesn't match");
        PrintIfNotEmpty(inner_listener.str(), listener->stream());
        return !all_elements_should_match;
      }
    }
    return all_elements_should_match;
  }